

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTreeInterfaces.cpp
# Opt level: O0

void __thiscall
Indexing::CodeTreeTIS<Indexing::TermLiteralClause>::ResultIterator::ResultIterator
          (ResultIterator *this,CodeTreeTIS<Indexing::TermLiteralClause> *tree,TermList t,
          bool retrieveSubstitutions)

{
  TermMatcher *this_00;
  CodeTreeSubstitution<Indexing::TermLiteralClause> *this_01;
  BindingArray *bindings;
  Renaming *resultNormalizer;
  byte in_CL;
  _func_int **in_RSI;
  IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
  *in_RDI;
  Recycled<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_ffffffffffffff90;
  
  Lib::
  IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
  ::IteratorCore(in_RDI);
  in_RDI->_vptr_IteratorCore = (_func_int **)&PTR__ResultIterator_0130a990;
  Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_ffffffffffffff90);
  *(byte *)&in_RDI[2]._refCnt = in_CL & 1;
  in_RDI[3]._vptr_IteratorCore = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[3]._refCnt = 0;
  in_RDI[4]._vptr_IteratorCore = in_RSI;
  Lib::
  Recycled<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(in_stack_ffffffffffffff90);
  this_00 = Lib::
            Recycled<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            ::operator->((Recycled<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x351e7a);
  TermCodeTree<Indexing::TermLiteralClause>::TermMatcher::init
            (this_00,(EVP_PKEY_CTX *)(in_RDI[4]._vptr_IteratorCore + 1));
  if ((in_RDI[2]._refCnt & 1) != 0) {
    this_01 = (CodeTreeSubstitution<Indexing::TermLiteralClause> *)
              CodeTreeSubstitution<Indexing::TermLiteralClause>::operator_new(0x351ec2);
    bindings = (BindingArray *)
               Lib::
               Recycled<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               ::operator->((Recycled<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x351ed7);
    resultNormalizer =
         Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator*
                   ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
                    0x351ef9);
    CodeTreeSubstitution<Indexing::TermLiteralClause>::CodeTreeSubstitution
              (this_01,bindings,resultNormalizer);
    in_RDI[1]._vptr_IteratorCore = (_func_int **)this_01;
  }
  return;
}

Assistant:

ResultIterator(CodeTreeTIS* tree, TermList t, bool retrieveSubstitutions)
  : _retrieveSubstitutions(retrieveSubstitutions),
    _found(0), _finished(false), _tree(tree)
  {
    _matcher->init(&_tree->_ct, t);

    if(_retrieveSubstitutions) {
      _subst = new CodeTreeSubstitution<Data>(&_matcher->bindings, &*_resultNormalizer);
    }
  }